

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::PrimitiveGen
          (DrawIndirectBase *this,GLenum primitiveType,uint drawSizeX,uint drawSizeY,
          CColorArray *output)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  runtime_error *this_00;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector<float,_4> local_70;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  ulong local_48;
  float local_3c;
  uint local_38;
  float local_34;
  
  if (0xd < primitiveType) {
switchD_00b9172e_caseD_7:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown primitive type!");
LAB_00b923d9:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar5 = (ulong)drawSizeY;
  local_48 = uVar5;
  switch(primitiveType) {
  case 0:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    iVar1 = *(int *)CONCAT44(extraout_var_01,iVar1);
    iVar2 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      fVar7 = 2.0 / (float)iVar1;
      local_58 = 2.0 / (float)*(int *)(CONCAT44(extraout_var_02,iVar2) + 4);
      local_54 = local_58 * 0.5;
      fVar8 = fVar7 * 0.5;
      uVar3 = 0;
      local_60 = fVar7;
      local_5c = fVar8;
      do {
        if (drawSizeX != 0) {
          fVar6 = (float)uVar3 * local_58 + -1.0 + local_54;
          uVar4 = 0;
          do {
            local_70.m_data[1] = fVar6;
            local_70.m_data[0] = (float)uVar4 * fVar7 + -1.0 + fVar8;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            uVar4 = uVar4 + 1;
            fVar7 = local_60;
            fVar8 = local_5c;
          } while (drawSizeX != uVar4);
        }
        uVar3 = uVar3 + 1;
      } while ((float)uVar3 != (float)local_48);
    }
    break;
  default:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeY * 2));
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      local_60 = 2.0 / (float)*(int *)(CONCAT44(extraout_var,iVar1) + 4);
      local_5c = local_60 * 0.5;
      local_58 = local_60 * 0.0625;
      uVar3 = 0;
      do {
        fVar7 = (float)uVar3 * local_60 + -1.0 + local_5c + local_58;
        local_70.m_data[1] = fVar7;
        local_70.m_data[0] = -1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[0] = 1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    break;
  case 4:
  case 5:
  case 6:
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
              (output,(ulong)(drawSizeX * 0xc));
    if (drawSizeX != 1) {
      if (drawSizeX != 0) {
        if (drawSizeY == 0) {
          return;
        }
        fVar7 = 2.0 / (float)drawSizeX;
        local_50 = 2.0 / (float)uVar5;
        uVar3 = 0;
        local_54 = fVar7;
        do {
          local_60 = (float)uVar3 * local_50 + -1.0;
          if (drawSizeX != 0) {
            local_5c = local_50 + local_60;
            uVar4 = 0;
            do {
              fVar7 = (float)uVar4 * fVar7 + -1.0;
              local_70.m_data[1] = local_60;
              local_70.m_data[0] = fVar7;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              local_58 = local_54 + fVar7;
              local_70.m_data[1] = local_60;
              local_70.m_data[0] = local_58;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              local_70.m_data[1] = local_5c;
              local_70.m_data[0] = fVar7;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              local_70.m_data[1] = local_60;
              local_70.m_data[0] = local_58;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              local_70.m_data[1] = local_5c;
              local_70.m_data[0] = local_58;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              local_70.m_data[1] = local_5c;
              local_70.m_data[0] = fVar7;
              local_70.m_data[2] = 0.0;
              local_70.m_data[3] = 1.0;
              std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
              emplace_back<tcu::Vector<float,4>>
                        ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output
                         ,&local_70);
              uVar4 = uVar4 + 1;
              fVar7 = local_54;
            } while (drawSizeX != uVar4);
          }
          uVar3 = uVar3 + 1;
        } while ((float)uVar3 != (float)local_48);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Invalid drawSizeX!");
      goto LAB_00b923d9;
    }
    local_70.m_data[0] = -1.0;
    local_70.m_data[1] = -1.0;
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_70
              );
    local_70.m_data[0] = 4.0;
    local_70.m_data[1] = -1.0;
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_70
              );
    local_70.m_data[0] = -1.0;
    local_70.m_data[1] = 4.0;
    goto LAB_00b92117;
  case 7:
  case 8:
  case 9:
    goto switchD_00b9172e_caseD_7;
  case 10:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    if (drawSizeY != 0) {
      local_5c = 2.0 / (float)*(int *)(CONCAT44(extraout_var_03,iVar1) + 4);
      local_58 = local_5c * 0.5;
      local_54 = local_5c * 0.0625;
      uVar3 = 0;
      do {
        fVar7 = (float)uVar3 * local_5c + -1.0 + local_58 + local_54;
        local_60 = fVar7 + -1.0;
        local_70.m_data[1] = local_60;
        local_70.m_data[0] = -1.5;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[1] = fVar7;
        local_70.m_data[0] = -1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[0] = 1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[1] = local_60;
        local_70.m_data[0] = 1.5;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    break;
  case 0xb:
    iVar1 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
              _vptr_RenderContext[4])();
    local_5c = 2.0 / (float)*(int *)(CONCAT44(extraout_var_00,iVar1) + 4);
    local_60 = local_5c * 0.5;
    local_70.m_data[1] = local_60;
    local_70.m_data[0] = -1.5;
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_70
              );
    if (drawSizeY != 0) {
      local_58 = local_5c * 0.0625;
      uVar3 = 0;
      do {
        fVar7 = (float)uVar3 * local_5c + -1.0 + local_60 + local_58;
        local_70.m_data[1] = fVar7;
        local_70.m_data[0] = -1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[0] = -1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[0] = 1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        local_70.m_data[0] = 1.0;
        local_70.m_data[2] = 0.0;
        local_70.m_data[3] = 1.0;
        std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
        emplace_back<tcu::Vector<float,4>>
                  ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                   &local_70);
        uVar3 = uVar3 + 1;
      } while (drawSizeY != uVar3);
    }
    local_70.m_data[1] = 1.0 - local_60;
    local_70.m_data[0] = 1.5;
LAB_00b92117:
    local_70.m_data[2] = 0.0;
    local_70.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
    emplace_back<tcu::Vector<float,4>>
              ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,&local_70
              );
    break;
  case 0xc:
    if (drawSizeX != 0) {
      fVar7 = 1.0 / (float)drawSizeX;
      local_4c = 1.0 / (float)uVar5;
      local_38 = 0;
      local_3c = local_4c + local_4c;
      local_34 = fVar7 + fVar7;
      local_54 = fVar7;
      do {
        local_60 = (float)local_38 * local_4c + -0.5;
        if (drawSizeY != 0) {
          local_5c = local_4c + local_60;
          local_48 = CONCAT44(local_48._4_4_,local_60 - local_4c);
          local_50 = local_3c + local_60;
          uVar3 = 0;
          do {
            fVar7 = (float)uVar3 * fVar7 + -0.5;
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_5c;
            local_70.m_data[0] = fVar7 - local_54;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_5c;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_58 = local_54 + fVar7;
            local_70.m_data[1] = local_5c;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = (float)local_48;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_5c;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = local_34 + fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_5c;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_50;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            uVar3 = uVar3 + 1;
            fVar7 = local_54;
          } while (drawSizeY != uVar3);
        }
        local_38 = local_38 + 1;
      } while (local_38 != drawSizeX);
    }
    break;
  case 0xd:
    if (drawSizeX != 0) {
      fVar7 = 1.0 / (float)drawSizeX;
      local_4c = 1.0 / (float)uVar5;
      local_38 = 0;
      local_3c = local_4c + local_4c;
      local_34 = fVar7 + fVar7;
      local_5c = fVar7;
      do {
        local_54 = (float)local_38 * local_4c + -0.5;
        if (drawSizeY != 0) {
          local_60 = local_4c + local_54;
          local_48 = CONCAT44(local_48._4_4_,local_54 - local_4c);
          local_50 = local_3c + local_54;
          uVar3 = 0;
          do {
            fVar7 = (float)uVar3 * fVar7 + -0.5;
            local_70.m_data[1] = local_54;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = fVar7 - local_5c;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_58 = local_5c + fVar7;
            local_70.m_data[1] = (float)local_48;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_54;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_50;
            local_70.m_data[0] = fVar7;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = local_60;
            local_70.m_data[0] = local_58;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            local_70.m_data[1] = (float)local_48;
            local_70.m_data[0] = fVar7 + local_34;
            local_70.m_data[2] = 0.0;
            local_70.m_data[3] = 1.0;
            std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
            emplace_back<tcu::Vector<float,4>>
                      ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)output,
                       &local_70);
            uVar3 = uVar3 + 1;
            fVar7 = local_5c;
          } while (drawSizeY != uVar3);
        }
        local_38 = local_38 + 1;
      } while (local_38 != drawSizeX);
    }
  }
  return;
}

Assistant:

void PrimitiveGen(GLenum primitiveType, unsigned int drawSizeX, unsigned int drawSizeY, CColorArray& output)
	{
		switch (primitiveType)
		{
		case GL_POINTS:
			PointsGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES:
		case GL_LINE_STRIP:
		case GL_LINE_LOOP:
			LinesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINES_ADJACENCY:
			LinesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_LINE_STRIP_ADJACENCY:
			LineStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES:
		case GL_TRIANGLE_STRIP:
		case GL_TRIANGLE_FAN:
			TrianglesGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLES_ADJACENCY:
			TrianglesAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		case GL_TRIANGLE_STRIP_ADJACENCY:
			TriangleStripAdjacencyGen(drawSizeX, drawSizeY, output);
			break;
		default:
			throw std::runtime_error("Unknown primitive type!");
			break;
		}
	}